

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

void __thiscall
TPZSkylMatrix<std::complex<double>_>::SetSkyline
          (TPZSkylMatrix<std::complex<double>_> *this,TPZVec<long> *skyline)

{
  TPZVec<std::complex<double>_> *in_stack_00000028;
  TPZVec<std::complex<double>_*> *in_stack_00000030;
  
  TPZVec<std::complex<double>_*>::Fill
            (in_stack_00000030,(complex<double> **)in_stack_00000028,(int64_t)this,(int64_t)skyline)
  ;
  InitializeElem((TPZVec<long> *)in_stack_00000030,in_stack_00000028,
                 (TPZVec<std::complex<double>_*> *)this);
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::SetSkyline(const TPZVec<int64_t> &skyline)
{
#ifdef PZDEBUG
	for (int64_t i = 0 ; i < this->Rows() ; i++){
		if (skyline[i] < 0 || skyline[i] > i) DebugStop();
	}
#endif
	fElem.Fill(0);
	InitializeElem(skyline,fStorage,fElem);
}